

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Dam_PrintDiv(Dam_Man_t *p,int iDiv)

{
  int iVar1;
  int Lit;
  int iVar2;
  uint uVar3;
  uint uVar4;
  abctime aVar5;
  undefined8 uVar6;
  float fVar7;
  int iData1;
  int iData0;
  char Buffer [100];
  int iDiv_local;
  Dam_Man_t *p_local;
  
  Buffer._92_4_ = iDiv;
  unique0x100002a0 = p;
  if (iDiv == 0) {
    printf("Final statistics after extracting %6d divisors:          ",(ulong)(uint)p->nDivs);
  }
  else {
    iVar1 = Hash_IntObjData0(p->vHash,iDiv);
    Lit = Hash_IntObjData1(stack0xfffffffffffffff0->vHash,Buffer._92_4_);
    printf("Div%5d : ",(ulong)(stack0xfffffffffffffff0->nDivs + 1));
    printf("D%-8d = ",(ulong)(uint)Buffer._92_4_);
    iVar2 = Abc_LitIsCompl(iVar1);
    uVar4 = 0x20;
    if (iVar2 != 0) {
      uVar4 = 0x21;
    }
    uVar3 = Abc_Lit2Var(iVar1);
    sprintf((char *)&iData1,"%c%d",(ulong)uVar4,(ulong)uVar3);
    printf("%8s ",&iData1);
    uVar6 = 0x2b;
    if (iVar1 < Lit) {
      uVar6 = 0x2a;
    }
    printf("%c  ",uVar6);
    iVar1 = Abc_LitIsCompl(Lit);
    uVar4 = 0x20;
    if (iVar1 != 0) {
      uVar4 = 0x21;
    }
    uVar3 = Abc_Lit2Var(Lit);
    sprintf((char *)&iData1,"%c%d",(ulong)uVar4,(ulong)uVar3);
    printf("%8s   ",&iData1);
    fVar7 = Vec_FltEntry(stack0xfffffffffffffff0->vCounts,Buffer._92_4_);
    printf("Weight %9.2f  ",(double)fVar7);
  }
  uVar4 = Hash_IntManEntryNum(stack0xfffffffffffffff0->vHash);
  printf("Divs =%8d  ",(ulong)uVar4);
  printf("Ands =%8d  ",
         (ulong)(uint)(stack0xfffffffffffffff0->nAnds - stack0xfffffffffffffff0->nGain));
  aVar5 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar5 - stack0xfffffffffffffff0->clkStart);
  return;
}

Assistant:

void Dam_PrintDiv( Dam_Man_t * p, int iDiv )
{
    if ( iDiv == 0 )
        printf( "Final statistics after extracting %6d divisors:          ", p->nDivs );
    else
    {
        char Buffer[100];
        int iData0 = Hash_IntObjData0(p->vHash, iDiv);
        int iData1 = Hash_IntObjData1(p->vHash, iDiv);
        printf( "Div%5d : ",  p->nDivs+1 );
        printf( "D%-8d = ",   iDiv );
        sprintf( Buffer, "%c%d", Abc_LitIsCompl(iData0)? '!':' ', Abc_Lit2Var(iData0) );
        printf( "%8s ",   Buffer );
        printf( "%c  ",     (iData0 < iData1) ? '*' : '+' );
        sprintf( Buffer, "%c%d", Abc_LitIsCompl(iData1)? '!':' ', Abc_Lit2Var(iData1) );
        printf( "%8s   ", Buffer );
        printf( "Weight %9.2f  ", Vec_FltEntry(p->vCounts, iDiv) );
    }
    printf( "Divs =%8d  ",  Hash_IntManEntryNum(p->vHash) );
    printf( "Ands =%8d  ",  p->nAnds - p->nGain );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
}